

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vmsumuhs_ppc(CPUPPCState_conflict *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,
                        ppc_avr_t *c)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  uint auStack_28 [2];
  uint32_t prod [8];
  
  lVar2 = 0;
  do {
    auStack_28[lVar2] = (uint)b->u16[lVar2] * (uint)a->u16[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  bVar1 = false;
  lVar2 = 3;
  do {
    uVar3 = (ulong)prod[lVar2 * 2 + -1] + (ulong)auStack_28[lVar2 * 2] + (ulong)c->u32[lVar2];
    if (uVar3 >> 0x20 != 0) {
      bVar1 = true;
    }
    if (0xfffffffe < uVar3) {
      uVar3 = 0xffffffff;
    }
    r->u32[lVar2] = (uint32_t)uVar3;
    bVar4 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar4);
  if (bVar1) {
    (env->vscr_sat).u32[0] = 1;
  }
  return;
}

Assistant:

void helper_vmsumuhs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    uint32_t prod[8];
    int i;
    int sat = 0;

    for (i = 0; i < ARRAY_SIZE(r->u16); i++) {
        prod[i] = a->u16[i] * b->u16[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        uint64_t t = (uint64_t)c->u32[i] + prod[2 * i] + prod[2 * i + 1];

        r->u32[i] = cvtuduw(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}